

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

void __thiscall DLoadSaveMenu::UnloadSaveData(DLoadSaveMenu *this)

{
  DLoadSaveMenu *this_local;
  
  if ((this->SavePic != (FTexture *)0x0) && (this->SavePic != (FTexture *)0x0)) {
    (*this->SavePic->_vptr_FTexture[1])();
  }
  if (this->SaveComment != (FBrokenLines *)0x0) {
    V_FreeBrokenLines(this->SaveComment);
  }
  if ((this->currentSavePic != (FileReader *)0x0) && (this->currentSavePic != (FileReader *)0x0)) {
    (*(this->currentSavePic->super_FileReaderBase)._vptr_FileReaderBase[1])();
  }
  this->SavePic = (FTexture *)0x0;
  this->SaveComment = (FBrokenLines *)0x0;
  this->currentSavePic = (FileReader *)0x0;
  TArray<char,_char>::Clear(&this->SavePicData);
  return;
}

Assistant:

void DLoadSaveMenu::UnloadSaveData ()
{
	if (SavePic != nullptr)
	{
		delete SavePic;
	}
	if (SaveComment != nullptr)
	{
		V_FreeBrokenLines (SaveComment);
	}
	if (currentSavePic != nullptr)
	{
		delete currentSavePic;
	}

	SavePic = nullptr;
	SaveComment = nullptr;
	currentSavePic = nullptr;
	SavePicData.Clear();
}